

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_set_cr1_from_fpscr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 ret;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx,ret,cpu_fpscr);
  tcg_gen_shri_i32_ppc64(tcg_ctx,cpu_crf[1],ret,0x1c);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_set_cr1_from_fpscr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_trunc_tl_i32(tcg_ctx, tmp, cpu_fpscr);
    tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], tmp, 28);
    tcg_temp_free_i32(tcg_ctx, tmp);
}